

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

void __thiscall QTextStreamPrivate::consumeLastToken(QTextStreamPrivate *this)

{
  QString *this_00;
  long lVar1;
  QArrayData *data;
  qsizetype qVar2;
  qsizetype qVar3;
  void *pvVar4;
  void *pvVar5;
  Flags FVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  
  lVar9 = this->lastTokenSize;
  if (lVar9 != 0) {
    if (this->string == (QString *)0x0) {
      lVar9 = lVar9 + this->readBufferOffset;
      this->readBufferOffset = lVar9;
      this_00 = &this->readBuffer;
      if (lVar9 < (this->readBuffer).d.size) {
        if (0x4000 < lVar9) {
          iVar7 = QString::remove(this_00,(char *)0x0);
          QString::operator=(this_00,(QString *)CONCAT44(extraout_var,iVar7));
          this->readConverterSavedStateOffset =
               this->readConverterSavedStateOffset + this->readBufferOffset;
          this->readBufferOffset = 0;
        }
      }
      else {
        this->readBufferOffset = 0;
        if ((this->readBuffer).d.ptr != (char16_t *)0x0) {
          data = &((this_00->d).d)->super_QArrayData;
          (this_00->d).d = (Data *)0x0;
          (this->readBuffer).d.ptr = (char16_t *)0x0;
          (this->readBuffer).d.size = 0;
          if (data != (QArrayData *)0x0) {
            LOCK();
            (data->ref_)._q_value.super___atomic_base<int>._M_i =
                 (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(data,2,0x10);
            }
          }
        }
        iVar8 = (*this->device->_vptr_QIODevice[5])();
        FVar6.super_QFlagsStorageHelper<QStringConverter::Flag,_4>.
        super_QFlagsStorage<QStringConverter::Flag>.i =
             (this->toUtf16).super_QStringConverter.state.flags.
             super_QFlagsStorageHelper<QStringConverter::Flag,_4>;
        iVar7 = (this->toUtf16).super_QStringConverter.state.internalState;
        qVar2 = (this->toUtf16).super_QStringConverter.state.remainingChars;
        qVar3 = (this->toUtf16).super_QStringConverter.state.invalidChars;
        pvVar4 = (this->toUtf16).super_QStringConverter.state.field_4.d[0];
        pvVar5 = (this->toUtf16).super_QStringConverter.state.field_4.d[1];
        (this->savedToUtf16).super_QStringConverter.iface =
             (this->toUtf16).super_QStringConverter.iface;
        (this->savedToUtf16).super_QStringConverter.state.flags =
             (Flags)FVar6.super_QFlagsStorageHelper<QStringConverter::Flag,_4>.
                    super_QFlagsStorage<QStringConverter::Flag>.i;
        (this->savedToUtf16).super_QStringConverter.state.internalState = iVar7;
        (this->savedToUtf16).super_QStringConverter.state.remainingChars = qVar2;
        (this->savedToUtf16).super_QStringConverter.state.invalidChars = qVar3;
        (this->savedToUtf16).super_QStringConverter.state.field_4.d[0] = pvVar4;
        (this->savedToUtf16).super_QStringConverter.state.field_4.d[1] = pvVar5;
        (this->savedToUtf16).super_QStringConverter.state.clearFn =
             (this->toUtf16).super_QStringConverter.state.clearFn;
        this->readBufferStartDevicePos = CONCAT44(extraout_var_00,iVar8);
        this->readConverterSavedStateOffset = 0;
      }
    }
    else {
      lVar9 = lVar9 + this->stringOffset;
      this->stringOffset = lVar9;
      lVar1 = (this->string->d).size;
      if (lVar1 < lVar9) {
        this->stringOffset = lVar1;
      }
    }
  }
  this->lastTokenSize = 0;
  return;
}

Assistant:

inline void QTextStreamPrivate::consumeLastToken()
{
    if (lastTokenSize)
        consume(lastTokenSize);
    lastTokenSize = 0;
}